

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp3
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp,JnHelperMethod helperMethodLeftDead)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  JnHelperMethod local_34;
  
  this_00 = instr->m_src1;
  local_34 = helperMethodLeftDead;
  OVar2 = IR::Opnd::GetKind(this_00);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_005a9c0e;
      *puVar4 = 0;
    }
    if (((ushort)this_00[1].m_valueType.field_0 & 1) != 0) {
      local_36 = (this_00->m_valueType).field_0;
      bVar3 = ValueType::IsNotString((ValueType *)&local_36.field_0);
      if (!bVar3) {
        if (local_34 != HelperOp_AddLeftDead) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2315,"(helperMethodLeftDead == IR::HelperOp_AddLeftDead)",
                             "helperMethodLeftDead == IR::HelperOp_AddLeftDead");
          if (!bVar3) {
LAB_005a9c0e:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        pIVar5 = LowerAddLeftDeadForString(this,instr);
        return pIVar5;
      }
    }
  }
  pIVar5 = LowerBinaryHelperMemWithTemp2(this,instr,helperMethod,helperMethodWithTemp);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp3(IR::Instr *instr, IR::JnHelperMethod helperMethod, IR::JnHelperMethod helperMethodWithTemp, IR::JnHelperMethod helperMethodLeftDead)
{
    IR::Opnd *src1 = instr->GetSrc1();

    if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_isTempLastUse && !src1->GetValueType().IsNotString())
    {
        Assert(helperMethodLeftDead == IR::HelperOp_AddLeftDead);
        return LowerAddLeftDeadForString(instr);
    }
    else
    {
        return this->LowerBinaryHelperMemWithTemp2(instr, helperMethod, helperMethodWithTemp);
    }
}